

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void h_predictor_16xh(uint8_t *dst,ptrdiff_t stride,uint8_t *left,int count)

{
  int in_ECX;
  __m128i *in_RDX;
  __m128i left_col_8p_hi;
  __m128i left_col_8p_lo;
  __m128i left_col;
  int i;
  ptrdiff_t stride_00;
  int iVar1;
  
  iVar1 = 0;
  do {
    stride_00 = (*in_RDX)[1];
    h_prediction_16x8_1(in_RDX,(uint8_t *)CONCAT44(in_ECX,iVar1),stride_00);
    h_prediction_16x8_2(in_RDX,(uint8_t *)CONCAT44(in_ECX,iVar1),stride_00);
    h_prediction_16x8_1(in_RDX,(uint8_t *)CONCAT44(in_ECX,iVar1),stride_00);
    h_prediction_16x8_2(in_RDX,(uint8_t *)CONCAT44(in_ECX,iVar1),stride_00);
    in_RDX = in_RDX + 1;
    iVar1 = iVar1 + 1;
  } while (iVar1 < in_ECX);
  return;
}

Assistant:

static inline void h_predictor_16xh(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *left, int count) {
  int i = 0;
  do {
    const __m128i left_col = _mm_load_si128((const __m128i *)left);
    const __m128i left_col_8p_lo = _mm_unpacklo_epi8(left_col, left_col);
    h_prediction_16x8_1(&left_col_8p_lo, dst, stride);
    dst += stride << 2;
    h_prediction_16x8_2(&left_col_8p_lo, dst, stride);
    dst += stride << 2;

    const __m128i left_col_8p_hi = _mm_unpackhi_epi8(left_col, left_col);
    h_prediction_16x8_1(&left_col_8p_hi, dst, stride);
    dst += stride << 2;
    h_prediction_16x8_2(&left_col_8p_hi, dst, stride);
    dst += stride << 2;

    left += 16;
    i++;
  } while (i < count);
}